

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscStatements.cpp
# Opt level: O2

Statement *
slang::ast::ProceduralCheckerStatement::fromSyntax
          (Compilation *comp,CheckerInstanceStatementSyntax *syntax,ASTContext *context,
          StatementContext *stmtCtx)

{
  SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax> *pSVar1;
  CheckerInstantiationSyntax *pCVar2;
  size_t sVar3;
  Scope *this;
  int iVar4;
  ProceduralBlockSymbol *pPVar5;
  Statement *pSVar6;
  HierarchicalInstanceSyntax *pHVar7;
  SourceLocation SVar8;
  undefined4 extraout_var;
  ProceduralCheckerStatement *pPVar9;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *extraout_RDX_01;
  EVP_PKEY_CTX *extraout_RDX_02;
  EVP_PKEY_CTX *src;
  DiagCode code;
  span<const_slang::ast::Symbol_*,_18446744073709551615UL> *args;
  SourceRange sourceRange;
  string_view name;
  iterator __begin2;
  Symbol *sym;
  SmallVector<const_slang::ast::Symbol_*,_5UL> instances;
  span<const_slang::ast::Symbol_*,_18446744073709551615UL> local_90;
  SourceRange local_80;
  SmallVectorBase<const_slang::ast::Symbol_*> local_70 [2];
  
  pPVar5 = ASTContext::getProceduralBlock(context);
  if ((pPVar5 == (ProceduralBlockSymbol *)0x0) || (pPVar5->procedureKind == Final)) {
    sourceRange = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
    code.subsystem = Statements;
    code.code = 10;
  }
  else {
    if (((stmtCtx->flags).m_bits & 2) == 0) {
      local_70[0].data_ = (pointer)local_70[0].firstElement;
      local_70[0].len = 0;
      local_70[0].cap = 5;
      pCVar2 = (syntax->instance).ptr;
      pSVar1 = &pCVar2->instances;
      local_90._M_extent._M_extent_value = 0;
      sVar3 = (pCVar2->instances).elements._M_extent._M_extent_value;
      src = extraout_RDX;
      local_90._M_ptr = (pointer)pSVar1;
      do {
        if (((SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax> *)local_90._M_ptr ==
             pSVar1) && (local_90._M_extent._M_extent_value == sVar3 + 1 >> 1)) {
          iVar4 = SmallVectorBase<const_slang::ast::Symbol_*>::copy
                            (local_70,(EVP_PKEY_CTX *)comp,src);
          local_90._M_ptr = (pointer)CONCAT44(extraout_var,iVar4);
          local_80 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
          args = &local_90;
          pPVar9 = BumpAllocator::
                   emplace<slang::ast::ProceduralCheckerStatement,std::span<slang::ast::Symbol_const*,18446744073709551615ul>,slang::SourceRange>
                             (&comp->super_BumpAllocator,args,&local_80);
          SmallVectorBase<const_slang::ast::Symbol_*>::cleanup(local_70,(EVP_PKEY_CTX *)args);
          return &pPVar9->super_Statement;
        }
        pHVar7 = slang::syntax::SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax>::
                 iterator_base<slang::syntax::HierarchicalInstanceSyntax_*>::dereference
                           ((iterator_base<slang::syntax::HierarchicalInstanceSyntax_*> *)&local_90)
        ;
        src = extraout_RDX_00;
        if (pHVar7->decl != (InstanceNameSyntax *)0x0) {
          this = (context->scope).ptr;
          name = parsing::Token::valueText(&pHVar7->decl->name);
          SVar8 = (SourceLocation)Scope::find(this,name);
          local_80.startLoc = SVar8;
          src = extraout_RDX_01;
          if (SVar8 != (SourceLocation)0x0) {
            for (; *(int *)SVar8 == 0x31;
                SVar8 = *(SourceLocation *)*(SyntaxNode **)((long)SVar8 + 0x78)) {
              if (*(long *)((long)SVar8 + 0x80) == 0) goto LAB_0045e9e1;
            }
            if (*(int *)SVar8 == 0x57) {
              SmallVectorBase<slang::ast::Symbol_const*>::
              emplace_back<slang::ast::Symbol_const*const&>
                        ((SmallVectorBase<slang::ast::Symbol_const*> *)local_70,(Symbol **)&local_80
                        );
              src = extraout_RDX_02;
            }
          }
        }
LAB_0045e9e1:
        local_90._M_extent._M_extent_value = local_90._M_extent._M_extent_value + 1;
      } while( true );
    }
    sourceRange = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
    code.subsystem = Statements;
    code.code = 9;
  }
  ASTContext::addDiag(context,code,sourceRange);
  pSVar6 = Statement::badStmt(comp,(Statement *)0x0);
  return pSVar6;
}

Assistant:

Statement& ProceduralCheckerStatement::fromSyntax(Compilation& comp,
                                                  const CheckerInstanceStatementSyntax& syntax,
                                                  const ASTContext& context,
                                                  StatementContext& stmtCtx) {
    auto proc = context.getProceduralBlock();
    if (!proc || proc->procedureKind == ProceduralBlockKind::Final) {
        context.addDiag(diag::CheckerNotInProc, syntax.sourceRange());
        return badStmt(comp, nullptr);
    }

    if (stmtCtx.flags.has(StatementFlags::InForkJoin)) {
        context.addDiag(diag::CheckerInForkJoin, syntax.sourceRange());
        return badStmt(comp, nullptr);
    }

    // Find all of the checkers that were pre-created for this syntax node.
    // It's possible to not find them if there were errors in the declaration,
    // so we don't issue errors here -- they are already handled.
    SmallVector<const Symbol*> instances;
    for (auto instSyntax : syntax.instance->instances) {
        if (auto decl = instSyntax->decl) {
            if (auto sym = context.scope->find(decl->name.valueText())) {
                auto nestedSym = sym;
                while (nestedSym->kind == SymbolKind::InstanceArray) {
                    auto& array = nestedSym->as<InstanceArraySymbol>();
                    if (array.elements.empty())
                        break;

                    nestedSym = array.elements[0];
                }

                if (nestedSym->kind == SymbolKind::CheckerInstance)
                    instances.push_back(sym);
            }
        }
    }

    return *comp.emplace<ProceduralCheckerStatement>(instances.copy(comp), syntax.sourceRange());
}